

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

void xmlCleanupCharEncodingHandlers(void)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  xmlCharEncodingHandlerPtr *ppxVar4;
  
  xmlCleanupEncodingAliases();
  if (handlers != (xmlCharEncodingHandlerPtr *)0x0) {
    uVar3 = (ulong)(uint)nbCharEncodingHandler;
    ppxVar4 = handlers;
    iVar2 = nbCharEncodingHandler;
    while (0 < iVar2) {
      nbCharEncodingHandler = (int)uVar3 - 1;
      uVar3 = (ulong)(uint)nbCharEncodingHandler;
      if (ppxVar4[uVar3] != (xmlCharEncodingHandlerPtr)0x0) {
        pcVar1 = ppxVar4[uVar3]->name;
        if (pcVar1 != (char *)0x0) {
          (*xmlFree)(pcVar1);
          ppxVar4 = handlers;
        }
        (*xmlFree)(ppxVar4[nbCharEncodingHandler]);
        uVar3 = (ulong)(uint)nbCharEncodingHandler;
        ppxVar4 = handlers;
      }
      iVar2 = (int)uVar3;
    }
    (*xmlFree)(ppxVar4);
    handlers = (xmlCharEncodingHandlerPtr *)0x0;
    nbCharEncodingHandler = 0;
  }
  return;
}

Assistant:

void
xmlCleanupCharEncodingHandlers(void) {
    xmlCleanupEncodingAliases();

    if (handlers == NULL) return;

    for (;nbCharEncodingHandler > 0;) {
        nbCharEncodingHandler--;
	if (handlers[nbCharEncodingHandler] != NULL) {
	    if (handlers[nbCharEncodingHandler]->name != NULL)
		xmlFree(handlers[nbCharEncodingHandler]->name);
	    xmlFree(handlers[nbCharEncodingHandler]);
	}
    }
    xmlFree(handlers);
    handlers = NULL;
    nbCharEncodingHandler = 0;
    xmlDefaultCharEncodingHandler = NULL;
}